

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O2

void on_message_receiver_state_changed
               (void *context,MESSAGE_RECEIVER_STATE new_state,MESSAGE_RECEIVER_STATE previous_state
               )

{
  byte bVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  code *UNRECOVERED_JUMPTABLE_00;
  undefined4 in_register_00000014;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uStack_8;
  
  uVar2 = CONCAT44(in_register_00000014,previous_state);
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                 ,"on_message_receiver_state_changed",0x200,1,
                 "on_message_receiver_state_changed called with NULL context");
      return;
    }
  }
  else if (new_state != previous_state) {
    if (*(int *)((long)context + 0x50) == 3) {
      if (new_state != MESSAGE_RECEIVER_STATE_OPEN) {
        *(undefined4 *)((long)context + 0x50) = 4;
        (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
        return;
      }
    }
    else if ((*(int *)((long)context + 0x50) == 1) && (new_state != MESSAGE_RECEIVER_STATE_OPENING))
    {
      if (new_state == MESSAGE_RECEIVER_STATE_OPEN) {
        bVar1 = *(byte *)((long)context + 0x68);
        uVar2 = (ulong)bVar1 | 2;
        *(char *)((long)context + 0x68) = (char)uVar2;
        if ((bVar1 & 1) == 0) {
          return;
        }
        *(undefined4 *)((long)context + 0x50) = 3;
        UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x30);
        uVar3 = *(undefined8 *)((long)context + 0x38);
        uStack_8 = 1;
      }
      else {
        *(undefined4 *)((long)context + 0x50) = 0;
        UNRECOVERED_JUMPTABLE_00 = *(code **)((long)context + 0x30);
        uVar3 = *(undefined8 *)((long)context + 0x38);
        uStack_8 = 2;
      }
      (*UNRECOVERED_JUMPTABLE_00)(uVar3,uStack_8,uVar2,UNRECOVERED_JUMPTABLE_00);
      return;
    }
  }
  return;
}

Assistant:

static void on_message_receiver_state_changed(const void* context, MESSAGE_RECEIVER_STATE new_state, MESSAGE_RECEIVER_STATE previous_state)
{
    IOTHUBTRANSPORT_AMQP_METHODS_HANDLE amqp_methods_handle = (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)context;
    if ((new_state != previous_state) &&
        (new_state == MESSAGE_RECEIVER_STATE_ERROR))
    {
        amqp_methods_handle->on_methods_error(amqp_methods_handle->on_methods_error_context);
    }
    else
    {
        if ((new_state == MESSAGE_RECEIVER_STATE_IDLE) && (previous_state == MESSAGE_RECEIVER_STATE_OPEN))
        {
            amqp_methods_handle->receiver_link_disconnected = true;
        }
        call_methods_unsubscribed_if_needed(amqp_methods_handle);
    }
}